

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,char *str)

{
  std::operator<<((ostream *)this,str);
  return;
}

Assistant:

void StreamState::append(const char *str)
{
	stream << str;
}